

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

_Bool ssh2_transport_timer_update(ssh2_transport_state *s,unsigned_long rekey_time)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  int ticks;
  
  uVar1 = conf_get_int(s->conf,0x1b);
  uVar3 = 0x3c;
  if (uVar1 < 0x8bd0) {
    uVar3 = uVar1;
  }
  uVar6 = (unsigned_long)(int)uVar3;
  ticks = uVar3 * 60000;
  if ((rekey_time != 0) && (uVar6 != rekey_time)) {
    uVar6 = getticks();
    uVar5 = rekey_time * 60000;
    uVar4 = uVar6 - s->last_rekey;
    uVar2 = (uVar5 - uVar6) + s->last_rekey;
    if (uVar5 < uVar4) {
      uVar2 = uVar5;
    }
    ticks = (int)uVar2;
    uVar6 = rekey_time;
    if (uVar5 < uVar4) {
      return true;
    }
  }
  if (s->gss_kex_used == true) {
    uVar1 = conf_get_int(s->conf,0x2d);
    uVar3 = 2;
    if (uVar1 < 0x8bd0) {
      uVar3 = uVar1;
    }
    if (uVar3 != 0) {
      uVar2 = (ulong)(int)uVar3;
      if (uVar2 < uVar6) {
        ticks = uVar3 * 60000;
      }
      if ((s->gss_status & 5U) == 1) {
        if (uVar6 < uVar2) {
          uVar2 = uVar6;
        }
        if (uVar2 * -0x3c + s->gss_ctxt_lifetime < 10) {
          ticks = ticks + -10000;
        }
      }
    }
  }
  uVar6 = schedule_timer(ticks,ssh2_transport_timer,s);
  s->next_rekey = uVar6;
  return false;
}

Assistant:

static bool ssh2_transport_timer_update(struct ssh2_transport_state *s,
                                        unsigned long rekey_time)
{
    unsigned long mins;
    unsigned long ticks;

    mins = sanitise_rekey_time(conf_get_int(s->conf, CONF_ssh_rekey_time), 60);
    ticks = mins * 60 * TICKSPERSEC;

    /* Handle change from previous setting */
    if (rekey_time != 0 && rekey_time != mins) {
        unsigned long next;
        unsigned long now = GETTICKCOUNT();

        mins = rekey_time;
        ticks = mins * 60 * TICKSPERSEC;
        next = s->last_rekey + ticks;

        /* If overdue, caller will rekey synchronously now */
        if (now - s->last_rekey > ticks)
            return true;
        ticks = next - now;
    }

#ifndef NO_GSSAPI
    if (s->gss_kex_used) {
        /*
         * If we've used GSSAPI key exchange, then we should
         * periodically check whether we need to do another one to
         * pass new credentials to the server.
         */
        unsigned long gssmins;

        /* Check cascade conditions more frequently if configured */
        gssmins = sanitise_rekey_time(
            conf_get_int(s->conf, CONF_gssapirekey), GSS_DEF_REKEY_MINS);
        if (gssmins > 0) {
            if (gssmins < mins)
                ticks = (mins = gssmins) * 60 * TICKSPERSEC;

            if ((s->gss_status & GSS_KEX_CAPABLE) != 0) {
                /*
                 * Run next timer even sooner if it would otherwise be
                 * too close to the context expiration time
                 */
                if ((s->gss_status & GSS_CTXT_EXPIRES) == 0 &&
                    s->gss_ctxt_lifetime - mins * 60 < 2 * MIN_CTXT_LIFETIME)
                    ticks -= 2 * MIN_CTXT_LIFETIME * TICKSPERSEC;
            }
        }
    }
#endif

    /* Schedule the next timer */
    s->next_rekey = schedule_timer(ticks, ssh2_transport_timer, s);
    return false;
}